

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabelPrivate::movieResized(QLabelPrivate *this,QSize *size)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QWidget::update(this_00);
  this->field_0x340 = this->field_0x340 & 0xfe;
  local_30.x1.m_i = 0;
  local_30.y1.m_i = 0;
  local_30.y2.m_i = (*size).ht.m_i + -1;
  local_30.x2.m_i = (*size).wd.m_i + -1;
  movieUpdated(this,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QWidget::updateGeometry(this_00);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::movieResized(const QSize &size)
{
    Q_Q(QLabel);
    q->update(); //we need to refresh the whole background in case the new size is smaller
    valid_hints = false;
    movieUpdated(QRect(QPoint(0,0), size));
    q->updateGeometry();
}